

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O2

void glslang::OptimizerMesssageConsumer
               (spv_message_level_t level,char *source,spv_position_t *position,char *message)

{
  ostream *poVar1;
  
  if (level < (SPV_MSG_INFO|SPV_MSG_ERROR)) {
    std::operator<<((ostream *)&std::cerr,&DAT_0060de0c + *(int *)(&DAT_0060de0c + (ulong)level * 4)
                   );
  }
  if (source != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,source);
    std::operator<<(poVar1,":");
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,":");
  if (message != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr," ");
    std::operator<<(poVar1,message);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return;
}

Assistant:

void OptimizerMesssageConsumer(spv_message_level_t level, const char *source,
        const spv_position_t &position, const char *message)
{
    auto &out = std::cerr;
    switch (level)
    {
    case SPV_MSG_FATAL:
    case SPV_MSG_INTERNAL_ERROR:
    case SPV_MSG_ERROR:
        out << "error: ";
        break;
    case SPV_MSG_WARNING:
        out << "warning: ";
        break;
    case SPV_MSG_INFO:
    case SPV_MSG_DEBUG:
        out << "info: ";
        break;
    default:
        break;
    }
    if (source)
    {
        out << source << ":";
    }
    out << position.line << ":" << position.column << ":" << position.index << ":";
    if (message)
    {
        out << " " << message;
    }
    out << std::endl;
}